

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_decode_filename(char *filename,int *channels,int *sample_rate,short **output)

{
  int iVar1;
  stb_vorbis *psVar2;
  stb_vorbis *psVar3;
  undefined8 *in_RCX;
  uint *in_RDX;
  int *in_RSI;
  short *data2;
  int n;
  stb_vorbis *v;
  short *data;
  int error;
  int limit;
  int total;
  int offset;
  int data_len;
  stb_vorbis_alloc *in_stack_ffffffffffffff98;
  stb_vorbis *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  stb_vorbis *f;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  psVar2 = stb_vorbis_open_filename
                     ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (int *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (psVar2 == (stb_vorbis *)0x0) {
    local_4 = -1;
  }
  else {
    iVar1 = psVar2->channels * 0x1000;
    *in_RSI = psVar2->channels;
    if (in_RDX != (uint *)0x0) {
      *in_RDX = psVar2->sample_rate;
    }
    local_2c = 0;
    local_30 = 0;
    psVar3 = (stb_vorbis *)malloc((long)iVar1 << 1);
    local_34 = iVar1;
    if (psVar3 == (stb_vorbis *)0x0) {
      stb_vorbis_close((stb_vorbis *)0x20cb65);
      local_4 = -2;
    }
    else {
      do {
        do {
          f = psVar3;
          in_stack_ffffffffffffffac =
               stb_vorbis_get_frame_short_interleaved
                         (f,(int)((ulong)psVar2 >> 0x20),
                          (short *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
          if (in_stack_ffffffffffffffac == 0) {
            *in_RCX = f;
            stb_vorbis_close((stb_vorbis *)0x20cc4a);
            return local_2c;
          }
          local_2c = in_stack_ffffffffffffffac + local_2c;
          local_30 = in_stack_ffffffffffffffac * psVar2->channels + local_30;
          psVar3 = f;
        } while (local_30 + iVar1 <= local_34);
        local_34 = local_34 << 1;
        in_stack_ffffffffffffffa0 = (stb_vorbis *)realloc(f,(long)local_34 << 1);
        psVar3 = in_stack_ffffffffffffffa0;
      } while (in_stack_ffffffffffffffa0 != (stb_vorbis *)0x0);
      free(f);
      stb_vorbis_close((stb_vorbis *)0x20cc1a);
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

int stb_vorbis_decode_filename(const char *filename, int *channels, int *sample_rate, short **output)
{
   int data_len, offset, total, limit, error;
   short *data;
   stb_vorbis *v = stb_vorbis_open_filename(filename, &error, NULL);
   if (v == NULL) return -1;
   limit = v->channels * 4096;
   *channels = v->channels;
   if (sample_rate)
      *sample_rate = v->sample_rate;
   offset = data_len = 0;
   total = limit;
   data = (short *) malloc(total * sizeof(*data));
   if (data == NULL) {
      stb_vorbis_close(v);
      return -2;
   }
   for (;;) {
      int n = stb_vorbis_get_frame_short_interleaved(v, v->channels, data+offset, total-offset);
      if (n == 0) break;
      data_len += n;
      offset += n * v->channels;
      if (offset + limit > total) {
         short *data2;
         total *= 2;
         data2 = (short *) realloc(data, total * sizeof(*data));
         if (data2 == NULL) {
            free(data);
            stb_vorbis_close(v);
            return -2;
         }
         data = data2;
      }
   }
   *output = data;
   stb_vorbis_close(v);
   return data_len;
}